

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestInterruptCleanup::Run(BuildTestInterruptCleanup *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  TimeStamp TVar6;
  Builder *this_01;
  string err;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule interrupt\n  command = interrupt\nrule touch-interrupt\n  command = touch-interrupt\nbuild out1: interrupt in1\nbuild out2: touch-interrupt in2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out1",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out2",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
    VirtualFileSystem::Create(this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    piVar1 = &(this->super_BuildTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"in1",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
    VirtualFileSystem::Create(this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"in2",&local_6a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
    VirtualFileSystem::Create(this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    pTVar3 = g_current_test;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out1",&local_6a);
    this_01 = &(this->super_BuildTest).builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_68,&local_48);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7eb,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_68);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_48);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7ec,"\"\" == err");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_48);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7ed,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("interrupted by user",&local_48);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7ee,"\"interrupted by user\" == err");
    Builder::Cleanup(this_01);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out1",&local_6a);
    TVar6 = VirtualFileSystem::Stat(this_00,&local_68,&local_48);
    testing::Test::Check
              (pTVar3,0 < TVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f0,"fs_.Stat(\"out1\", &err) > 0");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::assign((char *)&local_48);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out2",&local_6a);
    pNVar5 = Builder::AddTarget(this_01,&local_68,&local_48);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f4,"builder_.AddTarget(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_68);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_48);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f5,"\"\" == err");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_48);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f6,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("interrupted by user",&local_48);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f7,"\"interrupted by user\" == err");
    Builder::Cleanup(this_01);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"out2",&local_6a);
    TVar6 = VirtualFileSystem::Stat(this_00,&local_68,&local_48);
    testing::Test::Check
              (pTVar3,TVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7f9,"0 == fs_.Stat(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, InterruptCleanup) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule interrupt\n"
"  command = interrupt\n"
"rule touch-interrupt\n"
"  command = touch-interrupt\n"
"build out1: interrupt in1\n"
"build out2: touch-interrupt in2\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("in2", "");

  // An untouched output of an interrupted command should be retained.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_EQ("", err);
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("interrupted by user", err);
  builder_.Cleanup();
  EXPECT_GT(fs_.Stat("out1", &err), 0);
  err = "";

  // A touched output of an interrupted command should be deleted.
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  EXPECT_EQ("", err);
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("interrupted by user", err);
  builder_.Cleanup();
  EXPECT_EQ(0, fs_.Stat("out2", &err));
}